

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O2

int yyrefill(GREG *G)

{
  size_t __size;
  int iVar1;
  char *pcVar2;
  
  while (G->buflen - G->pos < 0x200) {
    __size = (long)G->buflen * 2;
    G->buflen = (int)__size;
    pcVar2 = (char *)realloc(G->buf,__size);
    G->buf = pcVar2;
  }
  iVar1 = getc((FILE *)input);
  if (iVar1 == -1) {
    iVar1 = 0;
  }
  else {
    if ((iVar1 == 0xd) || (iVar1 == 10)) {
      lineNumber = lineNumber + 1;
    }
    G->buf[G->pos] = (char)iVar1;
    G->limit = G->limit + 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

YY_LOCAL(int) yyrefill(GREG *G)
{
  int yyn;
  while (G->buflen - G->pos < 512)
    {
      G->buflen *= 2;
      G->buf= (char*)YY_REALLOC(G->buf, G->buflen, G->data);
    }
  YY_INPUT((G->buf + G->pos), yyn, (G->buflen - G->pos), G->data);
  if (!yyn) return 0;
  G->limit += yyn;
  return 1;
}